

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrEOR0x4d(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  
  argument = absolute_addr(in_RDI);
  EOR(in_RDI,argument);
  return 4;
}

Assistant:

int CPU::instrEOR0x4d() {
	EOR(absolute_addr());
	return 4;
}